

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O1

int checkbox_width_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  char *pcVar6;
  Am_Drawonable *pAVar7;
  char *__s;
  size_t sVar8;
  int unaff_EBP;
  Am_String string;
  Am_Object obj;
  Am_Font font;
  Am_Object window;
  Am_Object local_60;
  Am_Value value;
  int str_width;
  int b;
  int a;
  int descent;
  int ascent;
  
  string.data = (Am_String_Data *)0x0;
  obj.data = (Am_Object_Data *)0x0;
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar5 = Am_Object::Get(self,0x188,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x1ae,1);
  Am_Value::operator=(&value,pAVar5);
  if (value.type == 0xa001) {
    Am_Object::operator=(&obj,&value);
LAB_00265596:
    pAVar5 = Am_Object::Get(self,0x17e,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    pcVar6 = Am_String::operator_cast_to_char_(&string);
    if (pcVar6 == (char *)0x0) {
      bVar1 = Am_Object::Valid(&obj);
      if (bVar1) {
        pAVar5 = Am_Object::Get(&obj,0x66,0);
        iVar4 = Am_Value::operator_cast_to_int(pAVar5);
        unaff_EBP = iVar4 + iVar2 + iVar3 * 2 + 8;
        goto LAB_0026570c;
      }
    }
    else {
      window.data = (Am_Object_Data *)0x0;
      Am_Font::Am_Font(&font,Am_FONT_FIXED,false,false,false,Am_FONT_MEDIUM);
      pAVar5 = Am_Object::Get(self,0x68,0);
      Am_Object::operator=(&window,pAVar5);
      pAVar5 = Am_Object::Get(self,0xac,0);
      Am_Font::operator=(&font,pAVar5);
      Am_Object::Am_Object(&local_60,&window);
      pAVar7 = GV_a_drawonable(&local_60);
      Am_Object::~Am_Object(&local_60);
      if (pAVar7 != (Am_Drawonable *)0x0) {
        pcVar6 = Am_String::operator_cast_to_char_(&string);
        __s = Am_String::operator_cast_to_char_(&string);
        sVar8 = strlen(__s);
        (*pAVar7->_vptr_Am_Drawonable[0x1a])
                  (pAVar7,&font,pcVar6,sVar8 & 0xffffffff,&str_width,&ascent,&descent,&a,&b);
        unaff_EBP = str_width + iVar2 + iVar3 * 2 + 8;
      }
      Am_Font::~Am_Font(&font);
      Am_Object::~Am_Object(&window);
      if (pAVar7 != (Am_Drawonable *)0x0) goto LAB_0026570c;
    }
  }
  else if (value.type == 0x8008) {
    Am_String::operator=(&string,&value);
    goto LAB_00265596;
  }
  unaff_EBP = iVar2 + 0x14;
LAB_0026570c:
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&obj);
  Am_String::~Am_String(&string);
  return unaff_EBP;
}

Assistant:

Am_Define_Formula(int, checkbox_width)
{
  Am_String string;
  Am_Object obj;
  Am_Value value;
  // string slot contains a formula which gets the real object based on the
  // value of the COMMAND slot
  int box_width = self.Get(Am_BOX_WIDTH);
  value = self.Peek(Am_REAL_STRING_OR_OBJ);
  if (value.type == Am_STRING)
    string = value;
  else if (value.type == Am_OBJECT)
    obj = value;
  else
    return 20 + box_width;

  int offset = self.Get(Am_ITEM_OFFSET);

  if ((const char *)string) {
    Am_Object window;
    Am_Font font;
    window = self.Get(Am_WINDOW);
    font = self.Get(Am_FONT);
    //GV_a_drawonable will work if not window valid
    Am_Drawonable *draw = GV_a_drawonable(window);
    if (draw) {
      int str_width, ascent, descent, a, b;
      draw->Get_String_Extents(font, string, strlen(string), str_width, ascent,
                               descent, a, b);
      return box_width + str_width + 8 + 2 * offset;
    }
  } else if (obj.Valid()) {
    int obj_width = obj.Get(Am_WIDTH);
    return box_width + obj_width + 8 + 2 * offset;
  }

  return 20 + box_width;
}